

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_gz.c
# Opt level: O0

void * nhr_gz_compress(void *buff,size_t buff_size,size_t *compressed_size,uchar method)

{
  int iVar1;
  int local_bc;
  size_t sStack_b8;
  int result;
  size_t out_size;
  size_t writed;
  Bytef *out_buff;
  z_stream zip;
  uchar method_local;
  size_t *compressed_size_local;
  size_t buff_size_local;
  void *buff_local;
  
  out_size = 0;
  sStack_b8 = 0x200;
  if ((buff == (void *)0x0) || (buff_size == 0)) {
    buff_local = (void *)0x0;
  }
  else {
    zip.reserved._7_1_ = method;
    memset(&out_buff,0,0x70);
    if (zip.reserved._7_1_ == '\0') {
      local_bc = deflateInit_(&out_buff,9,"1.2.11",0x70);
    }
    else {
      local_bc = deflateInit2_(&out_buff,9,8,0xfffffff1,8,0,"1.2.11",0x70);
    }
    if (local_bc == 0) {
      if (zip.reserved._7_1_ == '\x01') {
        sStack_b8 = 0x20a;
        writed = (size_t)nhr_malloc(0x20a);
        nhr_gz_write_header((Bytef *)writed);
        out_size = 10;
      }
      else {
        writed = (size_t)nhr_malloc(0x200);
      }
      zip.next_in._0_4_ = (int)buff_size;
      zip.next_out._0_4_ = 0x200;
      zip.total_in = writed + out_size;
      out_buff = (Bytef *)buff;
      while ((int)zip.next_in != 0) {
        iVar1 = deflate(&out_buff,0);
        if (iVar1 != 0) {
          deflateEnd(&out_buff);
          nhr_free((void *)writed);
          return (void *)0x0;
        }
        if ((int)zip.next_out == 0) {
          sStack_b8 = sStack_b8 + 0x200;
          out_size = out_size + 0x200;
          writed = (size_t)nhr_realloc((void *)writed,sStack_b8);
          zip.total_in = writed + out_size;
          zip.next_out._0_4_ = 0x200;
        }
      }
      do {
        if ((int)zip.next_out == 0) {
          sStack_b8 = sStack_b8 + 0x200;
          out_size = out_size + 0x200;
          writed = (size_t)nhr_realloc((void *)writed,sStack_b8);
          zip.total_in = writed + out_size;
          zip.next_out._0_4_ = 0x200;
        }
        iVar1 = deflate(&out_buff,4);
      } while (iVar1 == 0);
      if (iVar1 == 1) {
        out_size = zip._32_8_;
        if (zip.reserved._7_1_ == '\x01') {
          writed = (size_t)nhr_gz_write_footer((Bytef *)writed,sStack_b8,zip._32_8_ + 10,buff,
                                               buff_size);
          out_size = zip._32_8_ + 0x12;
        }
        if (compressed_size != (size_t *)0x0) {
          *compressed_size = out_size;
        }
        deflateEnd(&out_buff);
        buff_local = (void *)writed;
      }
      else {
        deflateEnd(&out_buff);
        nhr_free((void *)writed);
        buff_local = (void *)0x0;
      }
    }
    else {
      buff_local = (void *)0x0;
    }
  }
  return buff_local;
}

Assistant:

void * nhr_gz_compress(const void * buff,
					   const size_t buff_size,
					   size_t * compressed_size,
					   const unsigned char method) {
	z_stream zip;
	Bytef * out_buff = NULL;
	size_t writed = 0, out_size = NHR_GZ_CHUNK_SIZE;
	int result = Z_STREAM_ERROR;
	
	if (!buff || buff_size == 0) {
		return NULL;
	}
	memset(&zip, 0, sizeof(z_stream));

	if (method == NHR_GZ_METHOD_DEFLATE) {
		result = deflateInit(&zip, Z_BEST_COMPRESSION);
	} else {
		result = deflateInit2(&zip, Z_BEST_COMPRESSION, Z_DEFLATED, NHR_GZ_WINDOWS_BITS, 8, Z_DEFAULT_STRATEGY);
	}

	if (result != Z_OK) {
		return NULL;
	}

	if (method == NHR_GZ_METHOD_GZIP) {
		out_size += NHR_GZ_HEADER_SIZE;
		out_buff = (Bytef *)nhr_malloc(out_size);
		nhr_gz_write_header(out_buff);
		writed += NHR_GZ_HEADER_SIZE;
	} else {
		out_buff = (Bytef *)nhr_malloc(out_size);
	}

	zip.avail_in = (uInt)buff_size;
	zip.next_in = (Bytef *)buff;
	zip.avail_out = NHR_GZ_CHUNK_SIZE;
	zip.next_out = out_buff + writed;

	while (zip.avail_in) {
		if (deflate(&zip, Z_NO_FLUSH) != Z_OK) {
			deflateEnd(&zip);
			nhr_free(out_buff);
			return NULL;
		}
		if (zip.avail_out == 0) {
			out_size += NHR_GZ_CHUNK_SIZE;
			writed += NHR_GZ_CHUNK_SIZE;
			out_buff = (Bytef *)nhr_realloc(out_buff, out_size);
			zip.next_out = out_buff + writed;
			zip.avail_out = NHR_GZ_CHUNK_SIZE;
		}
	}

	do {
		if (zip.avail_out == 0) {
			out_size += NHR_GZ_CHUNK_SIZE;
			writed += NHR_GZ_CHUNK_SIZE;
			out_buff = (Bytef *)nhr_realloc(out_buff, out_size);
			zip.next_out = out_buff + writed;
			zip.avail_out = NHR_GZ_CHUNK_SIZE;
		}
		result = deflate(&zip, Z_FINISH);
	} while (result == Z_OK);

	if (result != Z_STREAM_END) {
		deflateEnd(&zip);
		nhr_free(out_buff);
		return NULL;
	}

	writed = zip.total_out; // write total from zip stream
	if (method == NHR_GZ_METHOD_GZIP) {
		writed += NHR_GZ_HEADER_SIZE;
		out_buff = nhr_gz_write_footer(out_buff, out_size, writed, buff, buff_size);
		writed += NHR_GZ_FOOTER_SIZE;
	}

	if (compressed_size) {
		*compressed_size = writed;
	}

	deflateEnd(&zip);
	return out_buff;
}